

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O1

Text * __thiscall xe::ri::List::allocItem<xe::ri::Text>(List *this)

{
  Text *pTVar1;
  Text *local_18;
  
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::reserve
            (&this->m_items,
             ((long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  pTVar1 = (Text *)operator_new(0x30);
  (pTVar1->super_Item).m_type = TYPE_TEXT;
  (pTVar1->super_Item)._vptr_Item = (_func_int **)&PTR__Text_0011b810;
  (pTVar1->text)._M_dataplus._M_p = (pointer)&(pTVar1->text).field_2;
  (pTVar1->text)._M_string_length = 0;
  (pTVar1->text).field_2._M_local_buf[0] = '\0';
  local_18 = pTVar1;
  std::vector<xe::ri::Item*,std::allocator<xe::ri::Item*>>::emplace_back<xe::ri::Item*>
            ((vector<xe::ri::Item*,std::allocator<xe::ri::Item*>> *)this,(Item **)&local_18);
  return pTVar1;
}

Assistant:

T* List::allocItem (void)
{
	m_items.reserve(m_items.size()+1);
	T* item = new T();
	m_items.push_back(static_cast<ri::Item*>(item));
	return item;
}